

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_internal.c
# Opt level: O2

void bench_group_add_var(void *arg,int iters)

{
  secp256k1_gej *r;
  secp256k1_fe *a;
  secp256k1_fe *a_00;
  secp256k1_fe *a_01;
  int iVar1;
  long lVar2;
  secp256k1_fe *psVar3;
  secp256k1_gej *psVar4;
  bool bVar5;
  byte bVar6;
  secp256k1_fe u1;
  secp256k1_fe local_1e8;
  secp256k1_fe s1;
  secp256k1_fe local_188;
  secp256k1_fe local_158;
  secp256k1_fe s2;
  secp256k1_fe u2;
  secp256k1_fe h3;
  secp256k1_fe z22;
  secp256k1_fe t;
  secp256k1_fe z12;
  
  bVar6 = 0;
  r = (secp256k1_gej *)((long)arg + 400);
  a = (secp256k1_fe *)((long)arg + 0x260);
  a_00 = (secp256k1_fe *)((long)arg + 0x1e0);
  a_01 = (secp256k1_fe *)((long)arg + 0x1b8);
  if (iters < 1) {
    iters = 0;
  }
  while( true ) {
    lVar2 = 0x10;
    bVar5 = iters == 0;
    iters = iters + -1;
    if (bVar5) break;
    psVar3 = (secp256k1_fe *)((long)arg + 0x210);
    psVar4 = r;
    if (*(int *)((long)arg + 0x208) == 0) {
      if (*(int *)((long)arg + 0x288) == 0) {
        secp256k1_fe_impl_sqr(&z22,a);
        secp256k1_fe_impl_sqr(&z12,a_00);
        secp256k1_fe_impl_mul(&u1,(secp256k1_fe *)r,&z22);
        secp256k1_fe_impl_mul(&u2,(secp256k1_fe *)((long)arg + 0x210),&z12);
        secp256k1_fe_impl_mul(&s1,a_01,&z22);
        secp256k1_fe_impl_mul(&s1,&s1,a);
        secp256k1_fe_impl_mul(&s2,(secp256k1_fe *)((long)arg + 0x238),&z12);
        secp256k1_fe_impl_mul(&s2,&s2,a_00);
        local_158.n[0] = (u2.n[0] - u1.n[0]) + 0x3ffffbfffff0bc;
        local_158.n[1] = (u2.n[1] - u1.n[1]) + 0x3ffffffffffffc;
        local_158.n[2] = (u2.n[2] - u1.n[2]) + 0x3ffffffffffffc;
        local_158.n[3] = (u2.n[3] - u1.n[3]) + 0x3ffffffffffffc;
        local_158.n[4] = (u2.n[4] - u1.n[4]) + 0x3fffffffffffc;
        local_188.n[0] = (s1.n[0] - s2.n[0]) + 0x3ffffbfffff0bc;
        local_188.n[1] = (s1.n[1] - s2.n[1]) + 0x3ffffffffffffc;
        local_188.n[2] = (s1.n[2] - s2.n[2]) + 0x3ffffffffffffc;
        local_188.n[3] = (s1.n[3] - s2.n[3]) + 0x3ffffffffffffc;
        local_188.n[4] = (s1.n[4] - s2.n[4]) + 0x3fffffffffffc;
        iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_158);
        if (iVar1 == 0) {
          *(undefined4 *)((long)arg + 0x208) = 0;
          secp256k1_fe_impl_mul(&t,&local_158,a);
          secp256k1_fe_impl_mul(a_00,a_00,&t);
          secp256k1_fe_impl_sqr(&local_1e8,&local_158);
          local_1e8.n[0] = 0x3ffffbfffff0bc - local_1e8.n[0];
          local_1e8.n[1] = 0x3ffffffffffffc - local_1e8.n[1];
          local_1e8.n[2] = 0x3ffffffffffffc - local_1e8.n[2];
          local_1e8.n[3] = 0x3ffffffffffffc - local_1e8.n[3];
          local_1e8.n[4] = 0x3fffffffffffc - local_1e8.n[4];
          secp256k1_fe_impl_mul(&h3,&local_1e8,&local_158);
          secp256k1_fe_impl_mul(&t,&u1,&local_1e8);
          secp256k1_fe_impl_sqr((secp256k1_fe *)r,&local_188);
          secp256k1_fe_impl_add((secp256k1_fe *)r,&h3);
          secp256k1_fe_impl_add((secp256k1_fe *)r,&t);
          secp256k1_fe_impl_add((secp256k1_fe *)r,&t);
          secp256k1_fe_impl_add(&t,(secp256k1_fe *)r);
          secp256k1_fe_impl_mul(a_01,&t,&local_188);
          secp256k1_fe_impl_mul(&h3,&h3,&s1);
          secp256k1_fe_impl_add(a_01,&h3);
        }
        else {
          iVar1 = secp256k1_fe_impl_normalizes_to_zero_var(&local_188);
          if (iVar1 == 0) {
            secp256k1_gej_set_infinity(r);
          }
          else {
            secp256k1_gej_double_var(r,r,(secp256k1_fe *)0x0);
          }
        }
      }
    }
    else {
      for (; lVar2 != 0; lVar2 = lVar2 + -1) {
        (psVar4->x).n[0] = psVar3->n[0];
        psVar3 = (secp256k1_fe *)((long)psVar3 + ((ulong)bVar6 * -2 + 1) * 8);
        psVar4 = (secp256k1_gej *)((long)psVar4 + (ulong)bVar6 * -0x10 + 8);
      }
    }
  }
  return;
}

Assistant:

static void bench_group_add_var(void* arg, int iters) {
    int i;
    bench_inv *data = (bench_inv*)arg;

    for (i = 0; i < iters; i++) {
        secp256k1_gej_add_var(&data->gej[0], &data->gej[0], &data->gej[1], NULL);
    }
}